

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_measures.cc
# Opt level: O0

S1Angle __thiscall S2::GetLength(S2 *this,S2PointSpan polyline)

{
  ulong uVar1;
  size_type sVar2;
  reference x;
  reference y;
  S1Angle local_30;
  int local_24;
  undefined1 auStack_20 [4];
  int i;
  S2PointSpan polyline_local;
  S1Angle length;
  
  polyline_local.ptr_ = polyline.ptr_;
  _auStack_20 = this;
  S1Angle::S1Angle((S1Angle *)&polyline_local.len_);
  local_24 = 1;
  while( true ) {
    uVar1 = (ulong)local_24;
    sVar2 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)auStack_20);
    if (sVar2 <= uVar1) break;
    x = absl::Span<const_Vector3<double>_>::operator[]
                  ((Span<const_Vector3<double>_> *)auStack_20,(long)(local_24 + -1));
    y = absl::Span<const_Vector3<double>_>::operator[]
                  ((Span<const_Vector3<double>_> *)auStack_20,(long)local_24);
    S1Angle::S1Angle(&local_30,x,y);
    S1Angle::operator+=((S1Angle *)&polyline_local.len_,local_30);
    local_24 = local_24 + 1;
  }
  return (S1Angle)(double)polyline_local.len_;
}

Assistant:

S1Angle GetLength(S2PointSpan polyline) {
  S1Angle length;
  for (int i = 1; i < polyline.size(); ++i) {
    length += S1Angle(polyline[i - 1], polyline[i]);
  }
  return length;
}